

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O0

shared_ptr<ComplexType> __thiscall SNMPPacket::generateVarBindList(SNMPPacket *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<ComplexType> sVar3;
  shared_ptr<BER_CONTAINER> local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  ComplexType local_a8;
  undefined1 local_80 [8];
  shared_ptr<ComplexType> varBind;
  VarBind *varBindItem;
  iterator __end1;
  iterator __begin1;
  deque<VarBind,_std::allocator<VarBind>_> *__range1;
  SNMPPacket *this_local;
  shared_ptr<ComplexType> *varBindList;
  
  std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)this);
  std::deque<VarBind,_std::allocator<VarBind>_>::begin
            ((iterator *)&__end1._M_node,(deque<VarBind,_std::allocator<VarBind>_> *)(in_RSI + 0x78)
            );
  std::deque<VarBind,_std::allocator<VarBind>_>::end
            ((iterator *)&varBindItem,(deque<VarBind,_std::allocator<VarBind>_> *)(in_RSI + 0x78));
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&varBindItem), bVar1) {
    varBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator*
                   ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end1._M_node);
    local_a8.values.
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x30;
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)local_80);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_80);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<OIDType,void>
              ((shared_ptr<BER_CONTAINER> *)(local_c8 + 0x10),
               (shared_ptr<OIDType> *)
               varBind.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
    ComplexType::addValueToList(&local_a8,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)&local_a8);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)(local_c8 + 0x10));
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_80);
    ComplexType::addValueToList((ComplexType *)local_c8,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_c8);
    peVar2 = std::__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ComplexType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<BER_CONTAINER>::shared_ptr<ComplexType,void>
              (&local_e8,(shared_ptr<ComplexType> *)local_80);
    ComplexType::addValueToList((ComplexType *)local_d8,(shared_ptr<BER_CONTAINER> *)peVar2);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr((shared_ptr<BER_CONTAINER> *)local_d8);
    std::shared_ptr<BER_CONTAINER>::~shared_ptr(&local_e8);
    std::shared_ptr<ComplexType>::~shared_ptr((shared_ptr<ComplexType> *)local_80);
    std::_Deque_iterator<VarBind,_VarBind_&,_VarBind_*>::operator++
              ((_Deque_iterator<VarBind,_VarBind_&,_VarBind_*> *)&__end1._M_node);
  }
  sVar3.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ComplexType>)sVar3.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ComplexType> SNMPPacket::generateVarBindList(){
    SNMP_LOGD("generateVarBindList from SNMPPacket");
    // This is for normal packets where our response values have already been built, not traps
    auto varBindList = std::make_shared<ComplexType>(STRUCTURE);

    for(const auto& varBindItem : varbindList){
        auto varBind = std::make_shared<ComplexType>(STRUCTURE);

        varBind->addValueToList(varBindItem.oid);
        varBind->addValueToList(varBindItem.value);

        varBindList->addValueToList(varBind);
    }

    return varBindList;
}